

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdiSubWindowPrivate::setActive(QMdiSubWindowPrivate *this,bool activate,bool changeFocus)

{
  QWidget *this_00;
  Data *pDVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  QFlagsStorage<Qt::WindowState> QVar4;
  WindowStates WVar5;
  int iVar6;
  int iVar7;
  QMenuBar *menuBar;
  Data *pDVar8;
  QWidget *pQVar9;
  QStyle *pQVar10;
  long in_FS_OFFSET;
  QRegion windowDecoration;
  QFlagsStorage<Qt::WindowState> local_68;
  QFlagsStorageHelper<Qt::WindowState,_4> local_5c;
  QRegion local_58;
  undefined1 *puStack_50;
  QFlagsStorageHelper<Qt::WindowState,_4> *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)&(this->super_QWidgetPrivate).field_0x10 == 0) || (this->activationEnabled != true))
  goto LAB_00453b5a;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (activate) {
    if ((this->isActive == false) && ((this_00->data->widget_attributes & 1) == 0)) {
      this->isActive = true;
      this->isExplicitlyDeactivated = false;
      QVar4.i = (Int)QWidget::windowState(this_00);
      ensureWindowState(this,WindowActive);
      QMetaObject::activate(&this_00->super_QObject,&QMdiSubWindow::staticMetaObject,1,(void **)0x0)
      ;
      menuBar = QMdiSubWindowPrivate::menuBar(this);
      if (menuBar != (QMenuBar *)0x0) {
        showButtonsInMenuBar(this,menuBar);
      }
      goto LAB_004539de;
    }
    if (!activate) goto LAB_004538c1;
LAB_00453a27:
    if ((this->isActive == true) && ((this_00->data->widget_attributes & 1) == 0)) {
      bVar3 = QWidget::hasFocus(this_00);
      if (!bVar3) {
        pQVar9 = QApplication::focusWidget();
        bVar3 = QWidget::isAncestorOf(this_00,pQVar9);
        if (!bVar3) {
          if (changeFocus) {
            setFocusWidget(this);
          }
          ensureWindowState(this,WindowActive);
        }
      }
    }
  }
  else {
LAB_004538c1:
    if (this->isActive == true) {
      this->isActive = false;
      QVar4.i = (Int)QWidget::windowState(this_00);
      WVar5 = QWidget::windowState(this_00);
      QWidget::overrideWindowState
                (this_00,(WindowStates)
                         ((uint)WVar5.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                                super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7));
      if (changeFocus) {
        pQVar9 = QApplication::focusWidget();
        if ((pQVar9 != (QWidget *)0x0) &&
           (((pDVar1 = (this->restoreFocusWidget).wp.d, pDVar1 == (Data *)0x0 ||
             (*(int *)(pDVar1 + 4) == 0)) || ((this->restoreFocusWidget).wp.value == (QObject *)0x0)
            ))) {
          bVar3 = QWidget::isAncestorOf(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,pQVar9)
          ;
          if (bVar3) {
            pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                       (&pQVar9->super_QObject);
            pDVar1 = (this->restoreFocusWidget).wp.d;
            (this->restoreFocusWidget).wp.d = pDVar8;
            (this->restoreFocusWidget).wp.value = &pQVar9->super_QObject;
            if (pDVar1 != (Data *)0x0) {
              LOCK();
              *(int *)pDVar1 = *(int *)pDVar1 + -1;
              UNLOCK();
              if (*(int *)pDVar1 == 0) {
                operator_delete(pDVar1);
              }
            }
          }
        }
        pQVar9 = QApplication::focusWidget();
        if (pQVar9 != (QWidget *)0x0) {
          if (pQVar9 != this_00) {
            bVar3 = QWidget::isAncestorOf(this_00,pQVar9);
            if (!bVar3) goto LAB_0045398d;
          }
          QWidget::clearFocus(pQVar9);
        }
      }
LAB_0045398d:
      pDVar1 = (this->baseWidget).wp.d;
      if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
         ((this->baseWidget).wp.value != (QObject *)0x0)) {
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar9 = (QWidget *)0x0;
        }
        else {
          pQVar9 = (QWidget *)(this->baseWidget).wp.value;
        }
        WVar5 = QWidget::windowState((QWidget *)(this->baseWidget).wp.value);
        QWidget::overrideWindowState
                  (pQVar9,(WindowStates)
                          ((uint)WVar5.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                                 super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7));
      }
LAB_004539de:
      local_5c.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)QWidget::windowState(this_00);
      local_48 = &local_5c;
      local_58.d = (QRegionData *)0x0;
      local_68.i = QVar4.i;
      puStack_50 = (undefined1 *)&local_68;
      QMetaObject::activate(&this_00->super_QObject,&QMdiSubWindow::staticMetaObject,0,&local_58.d);
    }
    if (activate) goto LAB_00453a27;
  }
  pQVar10 = QWidget::style(this_00);
  iVar6 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x2c,0,this_00);
  iVar7 = titleBarHeight(this);
  local_58.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = this_00->data;
  QRegion::QRegion(&local_58,0,0,((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1,
                   ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1,Rectangle);
  pQVar2 = this_00->data;
  QRegion::QRegion((QRegion *)&local_68,iVar6,iVar7,
                   (((pQVar2->crect).x2.m_i + iVar6 * -2) - (pQVar2->crect).x1.m_i) + 1,
                   ((pQVar2->crect).y2.m_i - (iVar6 + iVar7 + (pQVar2->crect).y1.m_i)) + 1,Rectangle
                  );
  QRegion::operator-=(&local_58,(QRegion *)&local_68);
  QRegion::~QRegion((QRegion *)&local_68);
  if ((this->resizeTimer).m_id != Invalid) {
    QBasicTimer::stop();
    updateDirtyRegions(this);
  }
  QWidget::update(this_00,&local_58);
  QRegion::~QRegion(&local_58);
LAB_00453b5a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setActive(bool activate, bool changeFocus)
{
    Q_Q(QMdiSubWindow);
    if (!parent || !activationEnabled)
        return;

    if (activate && !isActive && q->isEnabled()) {
        isActive = true;
        isExplicitlyDeactivated = false;
        Qt::WindowStates oldWindowState = q->windowState();
        ensureWindowState(Qt::WindowActive);
        emit q->aboutToActivate();
#if QT_CONFIG(menubar)
        if (QMenuBar *mBar = menuBar())
            showButtonsInMenuBar(mBar);
#endif
        Q_ASSERT(isActive);
        emit q->windowStateChanged(oldWindowState, q->windowState());
    } else if (!activate && isActive) {
        isActive = false;
        Qt::WindowStates oldWindowState = q->windowState();
        q->overrideWindowState(q->windowState() & ~Qt::WindowActive);
        if (changeFocus) {
            storeFocusWidget();
            QWidget *focusWidget = QApplication::focusWidget();
            if (focusWidget && (focusWidget == q || q->isAncestorOf(focusWidget)))
                focusWidget->clearFocus();
        }
        if (baseWidget)
            baseWidget->overrideWindowState(baseWidget->windowState() & ~Qt::WindowActive);
        Q_ASSERT(!isActive);
        emit q->windowStateChanged(oldWindowState, q->windowState());
    }

    if (activate && isActive && q->isEnabled() && !q->hasFocus()
            && !q->isAncestorOf(QApplication::focusWidget())) {
        if (changeFocus)
            setFocusWidget();
        ensureWindowState(Qt::WindowActive);
    }

    int frameWidth = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);
    int titleBarHeight = this->titleBarHeight();
    QRegion windowDecoration = QRegion(0, 0, q->width(), q->height());
    windowDecoration -= QRegion(frameWidth, titleBarHeight, q->width() - 2 * frameWidth,
                                q->height() - titleBarHeight - frameWidth);

    // Make sure we don't use cached style options if we get
    // resize events right before activation/deactivation.
    if (resizeTimer.isActive()) {
        resizeTimer.stop();
        updateDirtyRegions();
    }

    q->update(windowDecoration);
}